

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.h
# Opt level: O1

void __thiscall
anurbs::RTree<2L>::sort
          (RTree<2L> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *values,Index left,
          Index right)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  pointer puVar4;
  ulong uVar5;
  pointer plVar6;
  long lVar7;
  pointer pMVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  unsigned_long __tmp;
  long lVar16;
  double tmp [2];
  
  while (left < right) {
    uVar3 = *(ulong *)((long)(values->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_start +
                      (right + left & 0xfffffffffffffffeU) * 4);
    lVar12 = left + -1;
    lVar14 = right + 1;
    while( true ) {
      puVar4 = (values->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar7 = lVar12 << 4;
      do {
        lVar13 = lVar7;
        uVar5 = puVar4[lVar12 + 1];
        lVar12 = lVar12 + 1;
        lVar7 = lVar13 + 0x10;
      } while (uVar5 < uVar3);
      lVar7 = lVar14 << 4;
      lVar14 = lVar14 + 1;
      do {
        lVar16 = lVar14;
        lVar15 = lVar7;
        lVar7 = lVar15 + -0x10;
        lVar14 = lVar16 + -1;
      } while (uVar3 < puVar4[lVar16 + -2]);
      lVar14 = lVar16 + -2;
      if (lVar14 <= lVar12) break;
      puVar4[lVar12] = puVar4[lVar16 + -2];
      puVar4[lVar16 + -2] = uVar5;
      plVar6 = (this->m_indices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar7 = plVar6[lVar12];
      plVar6[lVar12] = plVar6[lVar16 + -2];
      plVar6[lVar16 + -2] = lVar7;
      pMVar8 = (this->m_boxes_min).
               super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (undefined8 *)
               ((long)&pMVar8[1].super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                       m_storage.m_data + lVar13);
      uVar9 = *puVar1;
      uVar10 = puVar1[1];
      puVar1 = (undefined8 *)
               ((long)&pMVar8[-1].super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                       m_storage.m_data + lVar15);
      uVar11 = puVar1[1];
      puVar2 = (undefined8 *)
               ((long)&pMVar8[1].super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                       m_storage.m_data + lVar13);
      *puVar2 = *puVar1;
      puVar2[1] = uVar11;
      puVar1 = (undefined8 *)
               ((long)&pMVar8[-1].super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                       m_storage.m_data + lVar15);
      *puVar1 = uVar9;
      puVar1[1] = uVar10;
      pMVar8 = (this->m_boxes_max).
               super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (undefined8 *)
               ((long)&pMVar8[1].super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                       m_storage.m_data + lVar13);
      uVar9 = *puVar1;
      uVar10 = puVar1[1];
      puVar1 = (undefined8 *)
               ((long)&pMVar8[-1].super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                       m_storage.m_data + lVar15);
      uVar11 = puVar1[1];
      puVar2 = (undefined8 *)
               ((long)&pMVar8[1].super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                       m_storage.m_data + lVar13);
      *puVar2 = *puVar1;
      puVar2[1] = uVar11;
      puVar1 = (undefined8 *)
               ((long)&pMVar8[-1].super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                       m_storage.m_data + lVar15);
      *puVar1 = uVar9;
      puVar1[1] = uVar10;
    }
    sort(this,values,left,lVar16 + -2);
    left = lVar16 + -1;
  }
  return;
}

Assistant:

void sort(std::vector<size_t>& values, const Index left, const Index right)
    {
        if (left >= right) {
            return;
        }

        const size_t pivot = values[(left + right) >> 1];

        Index i = left - 1;
        Index j = right + 1;

        while (true) {
            do {
                i += 1;
            } while(values[i] < pivot);

            do {
                j -= 1;
            } while(values[j] > pivot);

            if (i >= j) {
                break;
            }

            swap(values, i, j);
        }

        sort(values, left, j);
        sort(values, j + 1, right);
    }